

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O3

void __thiscall
btSimulationIslandManager::btSimulationIslandManager(btSimulationIslandManager *this)

{
  this->_vptr_btSimulationIslandManager = (_func_int **)&PTR__btSimulationIslandManager_0021cad0;
  btUnionFind::btUnionFind(&this->m_unionFind);
  (this->m_islandmanifold).m_ownsMemory = true;
  (this->m_islandmanifold).m_data = (btPersistentManifold **)0x0;
  (this->m_islandmanifold).m_size = 0;
  (this->m_islandmanifold).m_capacity = 0;
  (this->m_islandBodies).m_ownsMemory = true;
  (this->m_islandBodies).m_data = (btCollisionObject **)0x0;
  (this->m_islandBodies).m_size = 0;
  (this->m_islandBodies).m_capacity = 0;
  this->m_splitIslands = true;
  return;
}

Assistant:

btSimulationIslandManager::btSimulationIslandManager():
m_splitIslands(true)
{
}